

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_2084ed::check<half>(istream *is,half c)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  unsigned_short in_SI;
  float fVar3;
  float fVar4;
  half v;
  half *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  half local_12 [8];
  half local_2;
  
  local_2._h = in_SI;
  Imf_2_5::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
            );
  pcVar1 = std::type_info::name((type_info *)&half::typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,": expected ");
  poVar2 = (ostream *)::operator<<(poVar2,local_2);
  poVar2 = std::operator<<(poVar2,", got ");
  this = (void *)::operator<<(poVar2,local_12[0]);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  fVar3 = half::operator_cast_to_float(&local_2);
  fVar4 = half::operator_cast_to_float(local_12);
  if ((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = half]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}